

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareCoordinates_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *this_00;
  ulong uVar2;
  undefined *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  size_t position;
  allocator<char> local_31;
  
  lVar7 = test_case->m_texture_access_index * 0x18;
  lVar6 = test_case->m_source_texture_target_index * 0x30;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)",&local_31);
  lVar5 = *(long *)(texture_access + lVar7 + 8);
  lVar4 = *(long *)(texture_targets + lVar6);
  lVar6 = *(long *)(texture_targets + lVar6 + 8);
  uVar2 = (lVar6 + lVar4 + lVar5) - 1;
  if (texture_access[lVar7 + 0x11] == '\0') {
    if (3 < uVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xc9d);
      goto LAB_0092f3c9;
    }
    puVar3 = &DAT_01dba2e8;
  }
  else {
    if (3 < uVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xcb2);
LAB_0092f3c9:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar3 = &DAT_01dba308;
  }
  position = 0;
  Utils::replaceToken("TYPE",&position,*(GLchar **)(puVar3 + (lVar4 + lVar5 + lVar6) * 8 + -8),
                      __return_storage_ptr__);
  while (sVar1 = position, bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
    Utils::replaceToken("VAL_LIST",&position,"0, VAL_LIST",__return_storage_ptr__);
    position = sVar1 + 1;
  }
  while (sVar1 = position, bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
    Utils::replaceToken("VAL_LIST",&position,"0, VAL_LIST",__return_storage_ptr__);
    position = sVar1 + 1;
  }
  while (sVar1 = position, bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
    Utils::replaceToken("VAL_LIST",&position,"1, VAL_LIST",__return_storage_ptr__);
    position = sVar1 + 1;
  }
  Utils::replaceToken(", VAL_LIST",&position,"",__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareCoordinates(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = 0;

	std::string coordinates = "TYPE(VAL_LIST)";

	if (false == access.m_use_integral_coordinates)
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "float";
			break;
		case 2:
			type = "vec2";
			break;
		case 3:
			type = "vec3";
			break;
		case 4:
			type = "vec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}
	else
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "int";
			break;
		case 2:
			type = "ivec2";
			break;
		case 3:
			type = "ivec3";
			break;
		case 4:
			type = "ivec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, coordinates);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < target.m_n_array_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < access.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "1, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", coordinates);

	return coordinates;
}